

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O1

real_t __thiscall
xLearn::Trainer::calc_gradient
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *reader)

{
  Reader *pRVar1;
  int iVar2;
  pointer ppRVar3;
  ostream *poVar4;
  ulong uVar5;
  real_t extraout_XMM0_Da;
  DMatrix *matrix;
  Logger local_64;
  string local_60;
  string local_40;
  
  if ((reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    (*this->loss_->_vptr_Loss[7])();
    ppRVar3 = (reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppRVar3) {
      uVar5 = 0;
      do {
        (*ppRVar3[uVar5]->_vptr_Reader[5])();
        local_60._M_dataplus._M_p = (pointer)0x0;
        while( true ) {
          pRVar1 = (reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)
                   ._M_impl.super__Vector_impl_data._M_start[uVar5];
          iVar2 = (*pRVar1->_vptr_Reader[4])(pRVar1,&local_60);
          if (iVar2 == 0) break;
          (*this->loss_->_vptr_Loss[4])(this->loss_,local_60._M_dataplus._M_p,this->model_);
        }
        uVar5 = uVar5 + 1;
        ppRVar3 = (reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(reader->
                                     super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar3 >>
                              3));
    }
    (*this->loss_->_vptr_Loss[6])();
    return extraout_XMM0_Da;
  }
  local_64.severity_ = ERR;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/trainer.cc"
             ,"");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"calc_gradient","");
  poVar4 = Logger::Start(ERR,&local_60,0xfc,&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK_NE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/trainer.cc"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xfc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"reader.empty()",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"true",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  Logger::~Logger(&local_64);
  abort();
}

Assistant:

real_t Trainer::calc_gradient(std::vector<Reader*>& reader) {
  CHECK_NE(reader.empty(), true);
  loss_->Reset();
  for (int i = 0; i < reader.size(); ++i) {
    reader[i]->Reset();
    DMatrix* matrix = nullptr;
    for (;;) {
      index_t tmp = reader[i]->Samples(matrix);
      if (tmp == 0) { break; }
      loss_->CalcGrad(matrix, *model_);
    }
  }
  return loss_->GetLoss();
}